

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseHexLiteral(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                *this)

{
  bool bVar1;
  UTF8Reader t;
  anon_class_1_0_00000001 local_19;
  UTF8Reader local_18;
  UTF8Reader local_10;
  
  local_18.data = (this->input).data;
  bVar1 = UTF8Reader::advanceIfStartsWith<char_const*>(&local_18,"0x","0X");
  if (bVar1) {
    local_10.data = local_18.data;
    bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::
            parseIntegerWithBase<16,soul::Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::parseHexLiteral()::_lambda(unsigned_int)_1_>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,&local_10,&local_19);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool parseHexLiteral()
    {
        auto t = input;

        if (t.advanceIfStartsWith ("0x", "0X"))
            return parseIntegerWithBase<16> (t, [] (UnicodeChar c) -> int { return choc::text::hexDigitToInt (c); });

        return false;
    }